

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

pointer __thiscall
google::
dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
::alloc_impl<google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::
realloc_or_die(alloc_impl<google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
               *this,pointer ptr,size_type n)

{
  int iVar1;
  int iVar2;
  long lVar3;
  pointer ppVar4;
  
  ppVar4 = (pointer)realloc(ptr,n * 8);
  if (ppVar4 != (pointer)0x0) {
    return ppVar4;
  }
  dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
  ::alloc_impl<google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::
  realloc_or_die();
  ppVar4 = *(pointer *)(n + 8);
  if (ppVar4 != *(pointer *)(n + 0x10)) {
    lVar3 = *(long *)n;
    iVar1 = *(int *)(lVar3 + 0x24);
    do {
      iVar2 = (ppVar4->first).i_;
      if (iVar1 != iVar2) {
        if (*(long *)(lVar3 + 0x28) == 0) {
          return ppVar4;
        }
        if (*(int *)(lVar3 + 0x20) != iVar2) {
          return ppVar4;
        }
      }
      ppVar4 = ppVar4 + 1;
      *(pointer *)(n + 8) = ppVar4;
    } while (ppVar4 != *(pointer *)(n + 0x10));
  }
  return ppVar4;
}

Assistant:

pointer realloc_or_die(pointer ptr, size_type n) {
      pointer retval = this->reallocate(ptr, n);
      if (retval == NULL) {
        fprintf(stderr,
                "sparsehash: FATAL ERROR: failed to reallocate "
                "%lu elements for ptr %p",
                static_cast<unsigned long>(n), static_cast<void*>(ptr));
        exit(1);
      }
      return retval;
    }